

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateSwitch(ExpressionEvalContext *ctx,ExprSwitch *expression)

{
  StackFrame *pSVar1;
  bool bVar2;
  StackFrame **ppSVar3;
  ExprBase *pEVar4;
  long local_58;
  longlong result;
  ExprBase *value;
  ExprBase *currBlock;
  ExprBase *currCase;
  ExprBase *pEStack_30;
  bool matched;
  ExprBase *condition;
  StackFrame *frame;
  ExprSwitch *expression_local;
  ExpressionEvalContext *ctx_local;
  
  frame = (StackFrame *)expression;
  expression_local = (ExprSwitch *)ctx;
  bVar2 = AddInstruction(ctx);
  if (bVar2) {
    ppSVar3 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back
                        ((SmallArray<ExpressionEvalContext::StackFrame_*,_32U> *)
                         &(expression_local->super_ExprBase).next);
    condition = (ExprBase *)*ppSVar3;
    if (((StackFrame *)condition)->targetYield == 0) {
      pEStack_30 = Evaluate((ExpressionEvalContext *)expression_local,
                            &((frame->variables).little[1].ptr)->super_ExprBase);
      if (pEStack_30 == (ExprBase *)0x0) {
        ctx_local = (ExpressionEvalContext *)0x0;
      }
      else {
        currCase._7_1_ = 0;
        value = (ExprBase *)(frame->variables).little[3].variable;
        for (currBlock = (ExprBase *)(frame->variables).little[2].variable;
            currBlock != (ExprBase *)0x0 && value != (ExprBase *)0x0; currBlock = currBlock->next) {
          bVar2 = AddInstruction((ExpressionEvalContext *)expression_local);
          if (!bVar2) {
            return (ExprBase *)0x0;
          }
          if ((currCase._7_1_ & 1) == 0) {
            result = (longlong)Evaluate((ExpressionEvalContext *)expression_local,currBlock);
            if ((ExprBase *)result == (ExprBase *)0x0) {
              return (ExprBase *)0x0;
            }
            bVar2 = TryTakeLong((ExprBase *)result,&local_58);
            if (!bVar2) {
              pEVar4 = Report((ExpressionEvalContext *)expression_local,
                              "ERROR: failed to evaluate \'case\' value");
              return pEVar4;
            }
            if (local_58 != 0) {
              currCase._7_1_ = 1;
              goto LAB_00191a42;
            }
          }
          else {
LAB_00191a42:
            pEVar4 = Evaluate((ExpressionEvalContext *)expression_local,value);
            pSVar1 = frame;
            if (pEVar4 == (ExprBase *)0x0) {
              return (ExprBase *)0x0;
            }
            if (*(int *)((long)&condition[0xb].type + 4) != 0) {
              *(int *)((long)&condition[0xb].type + 4) =
                   *(int *)((long)&condition[0xb].type + 4) + -1;
              pEVar4 = &ExpressionContext::get<ExprVoid>
                                  ((ExpressionContext *)
                                   (expression_local->super_ExprBase)._vptr_ExprBase)->
                        super_ExprBase;
              ExprVoid::ExprVoid((ExprVoid *)pEVar4,*(SynBase **)&(frame->variables).count,
                                 (TypeBase *)
                                 (expression_local->super_ExprBase)._vptr_ExprBase[0x1137]);
              pEVar4 = CheckType((ExprBase *)pSVar1,pEVar4);
              return pEVar4;
            }
          }
          value = value->next;
        }
        if ((frame->variables).little[4].variable != (VariableData *)0x0) {
          pEVar4 = Evaluate((ExpressionEvalContext *)expression_local,
                            (ExprBase *)(frame->variables).little[4].variable);
          pSVar1 = frame;
          if (pEVar4 == (ExprBase *)0x0) {
            return (ExprBase *)0x0;
          }
          if (*(int *)((long)&condition[0xb].type + 4) != 0) {
            *(int *)((long)&condition[0xb].type + 4) = *(int *)((long)&condition[0xb].type + 4) + -1
            ;
            pEVar4 = &ExpressionContext::get<ExprVoid>
                                ((ExpressionContext *)
                                 (expression_local->super_ExprBase)._vptr_ExprBase)->super_ExprBase;
            ExprVoid::ExprVoid((ExprVoid *)pEVar4,*(SynBase **)&(frame->variables).count,
                               (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1137]
                              );
            pEVar4 = CheckType((ExprBase *)pSVar1,pEVar4);
            return pEVar4;
          }
        }
        pSVar1 = frame;
        pEVar4 = &ExpressionContext::get<ExprVoid>
                            ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase)
                  ->super_ExprBase;
        ExprVoid::ExprVoid((ExprVoid *)pEVar4,*(SynBase **)&(frame->variables).count,
                           (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1137]);
        ctx_local = (ExpressionEvalContext *)CheckType((ExprBase *)pSVar1,pEVar4);
      }
    }
    else {
      ctx_local = (ExpressionEvalContext *)
                  Report((ExpressionEvalContext *)expression_local,
                         "ERROR: can\'t yield back into a switch statement");
    }
  }
  else {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluateSwitch(ExpressionEvalContext &ctx, ExprSwitch *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	if(frame->targetYield)
		return Report(ctx, "ERROR: can't yield back into a switch statement");

	ExprBase *condition = Evaluate(ctx, expression->condition);

	if(!condition)
		return NULL;

	bool matched = false;

	for(ExprBase *currCase = expression->cases.head, *currBlock = expression->blocks.head; currCase && currBlock; currCase = currCase->next, currBlock = currBlock->next)
	{
		if(!AddInstruction(ctx))
			return NULL;

		if(!matched)
		{
			ExprBase *value = Evaluate(ctx, currCase);

			if(!value)
				return NULL;

			long long result;
			if(!TryTakeLong(value, result))
				return Report(ctx, "ERROR: failed to evaluate 'case' value");

			// Try next case
			if(!result)
				continue;

			matched = true;
		}

		if(!Evaluate(ctx, currBlock))
			return NULL;

		// On break, decrease depth and exit
		if(frame->breakDepth)
		{
			frame->breakDepth--;

			return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
		}
	}

	if(expression->defaultBlock)
	{
		if(!Evaluate(ctx, expression->defaultBlock))
			return NULL;

		// On break, decrease depth and exit
		if(frame->breakDepth)
		{
			frame->breakDepth--;

			return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
		}
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}